

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

string_view __thiscall
google::protobuf::Reflection::ScratchSpace::CopyFromCord(ScratchSpace *this,Cord *cord)

{
  undefined8 uVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  pointer pbVar4;
  type this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_40 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> flat;
  Cord *cord_local;
  ScratchSpace *this_local;
  
  flat.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = cord;
  absl::lts_20240722::Cord::TryFlat
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_40,cord);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar2) {
    pbVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_40
                       );
    bVar5 = *pbVar3;
  }
  else {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (!bVar2) {
      std::make_unique<std::__cxx11::string>();
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->buffer_,&local_48);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&local_48);
    }
    uVar1 = flat.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _16_8_;
    pbVar4 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::get(&this->buffer_);
    absl::lts_20240722::CopyCordToString((Cord *)uVar1,(string *)pbVar4);
    this_00 = std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&this->buffer_);
    bVar5 = (basic_string_view<char,_std::char_traits<char>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  }
  sVar6._M_len = bVar5._M_len;
  sVar6._M_str = bVar5._M_str;
  return sVar6;
}

Assistant:

absl::string_view CopyFromCord(const absl::Cord& cord) {
      if (absl::optional<absl::string_view> flat = cord.TryFlat()) {
        return *flat;
      }
      if (!buffer_) {
        buffer_ = absl::make_unique<std::string>();
      }
      absl::CopyCordToString(cord, buffer_.get());
      return *buffer_;
    }